

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

Dialog * __thiscall Quest_Context::GetDialog(Quest_Context *this,short id)

{
  const_iterator cVar1;
  short local_a;
  
  if (((this->quest->quest->info).disabled == false) &&
     (local_a = id,
     cVar1 = std::
             _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Dialog>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
             ::find(&(this->dialogs)._M_t,&local_a),
     (_Rb_tree_header *)cVar1._M_node != &(this->dialogs)._M_t._M_impl.super__Rb_tree_header)) {
    return (Dialog *)cVar1._M_node[1]._M_parent;
  }
  return (Dialog *)0x0;
}

Assistant:

const Dialog* Quest_Context::GetDialog(short id) const
{
	if (this->quest->Disabled())
		return 0;

	auto it = this->dialogs.find(id);

	if (it == this->dialogs.end())
		return 0;

	// WARNING: returns a non-tracked reference to shared_ptr
	return it->second.get();
}